

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall ON_SubDMeshImpl::ON_SubDMeshImpl(ON_SubDMeshImpl *this,ON_SubDMeshImpl *src)

{
  bool bVar1;
  ON__UINT64 OVar2;
  size_t sVar3;
  ON_SubDMeshFragment *finished_fragment;
  ON_SubDMeshFragment *callback_fragment;
  
  this->m_mesh_content_serial_number = 0;
  this->m_absolute_subd_display_density = 0;
  this->m_fragment_count = 0;
  this->m_fragment_point_count = 0;
  this->m_first_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_last_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_has_curvatures = src->m_has_curvatures;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  (this->m_subdimple_wp).super___weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_subdimple_wp).super___weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_fragment_tree = (ON_RTree *)0x0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp);
  OVar2 = ON_NextContentSerialNumber();
  this->m_mesh_content_serial_number = OVar2;
  if (src->m_first_fragment != (ON_SubDMeshFragment *)0x0) {
    sVar3 = ON_FixedSizePool::ActiveElementCount(&src->m_fsp);
    bVar1 = ReserveCapacity(this,(uint)sVar3,src->m_absolute_subd_display_density);
    callback_fragment = src->m_first_fragment;
    if (bVar1 && callback_fragment != (ON_SubDMeshFragment *)0x0) {
      do {
        finished_fragment = CopyCallbackFragment(this,callback_fragment);
        AddFinishedFragment(this,finished_fragment);
        callback_fragment = callback_fragment->m_next_fragment;
      } while (callback_fragment != (ON_SubDMeshFragment *)0x0);
    }
  }
  return;
}

Assistant:

ON_SubDMeshImpl::ON_SubDMeshImpl( const class ON_SubDMeshImpl& src )
    : m_has_curvatures(src.m_has_curvatures)
{
  ChangeContentSerialNumber();
  if (nullptr != src.m_first_fragment &&
      ReserveCapacity((unsigned int)src.m_fsp.ActiveElementCount(),src.m_absolute_subd_display_density))
  {
    for (const ON_SubDMeshFragment* src_fragment = src.m_first_fragment; nullptr != src_fragment; src_fragment = src_fragment->m_next_fragment)
    {
      ON_SubDMeshFragment* fragment = CopyCallbackFragment(src_fragment);
      AddFinishedFragment(fragment);
    }
  }
}